

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O2

void asio::detail::executor_function::
     complete<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::read_op<asio::mutable_buffers_1>,asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,std::error_code,unsigned_long)>>>>,std::error_code,unsigned_long>,std::allocator<void>>
               (impl_base *base,bool call)

{
  allocator<void> allocator;
  ptr p;
  binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>_>_>,_std::error_code,_unsigned_long>
  function;
  allocator<void> local_129;
  ptr local_128;
  binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>_>_>,_std::error_code,_unsigned_long>
  local_110;
  
  local_128.a = &local_129;
  local_128.v = base;
  local_128.p = (impl<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>_>_>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
                 *)base;
  binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>_>_>,_std::error_code,_unsigned_long>
  ::binder2(&local_110,
            (binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>_>_>,_std::error_code,_unsigned_long>
             *)(base + 1));
  impl<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>_>_>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
  ::ptr::reset(&local_128);
  if (call) {
    binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>_>_>,_std::error_code,_unsigned_long>
    ::operator()(&local_110);
  }
  std::
  _Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  ::~_Tuple_impl(&local_110.handler_.handler_.handler_.handler_._M_bound_args.
                  super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                );
  impl<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>_>_>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
  ::ptr::~ptr(&local_128);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(ASIO_MOVE_CAST(Function)(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      asio_handler_invoke_helpers::invoke(function, function);
    }
  }